

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O3

bool Assimp::Blender::read<Assimp::Blender::MFace>
               (Structure *s,MFace *p,size_t cnt,FileDatabase *db)

{
  int *piVar1;
  MFace read;
  MFace local_58;
  
  if (cnt != 0) {
    piVar1 = &p->v1;
    do {
      local_58.super_ElemBase.dna_type = (char *)0x0;
      local_58.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_007e0ce0;
      Structure::Convert<Assimp::Blender::MFace>(s,&local_58,db);
      *(char **)(piVar1 + -2) = local_58.super_ElemBase.dna_type;
      *(undefined8 *)piVar1 = local_58._16_8_;
      *(ulong *)(piVar1 + 2) = CONCAT35(local_58.v4._1_3_,local_58._24_5_);
      *(ulong *)((long)piVar1 + 0xd) = CONCAT53(local_58._32_5_,local_58.v4._1_3_);
      piVar1 = piVar1 + 10;
      cnt = cnt - 1;
    } while (cnt != 0);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }